

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::baz(TestInterfaceImpl *this,BazContext context)

{
  Reader reader;
  bool bVar1;
  anon_class_8_1_bc11688f *func;
  undefined8 in_stack_fffffffffffffa48;
  bool local_57d;
  bool _kj_shouldLog;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  *local_570;
  Maybe<kj::Exception> local_568;
  DebugExpression<kj::Maybe<kj::Exception>_> local_3d0;
  undefined1 local_238 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  Reader params;
  TestInterfaceImpl *this_local;
  BazContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  params._reader._40_8_ = context.hook;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::getParams((Reader *)local_50,
              (CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
               *)&this_local);
  capnproto_test::capnp::test::TestInterface::BazParams::Reader::getS
            ((Reader *)&_kjCondition.result,(Reader *)local_50);
  reader._reader.capTable = (CapTableReader *)local_70;
  reader._reader.segment = (SegmentReader *)uStack_78;
  reader._reader.data = (void *)uStack_68;
  reader._reader.pointers = (WirePointer *)local_60;
  reader._reader._32_8_ = uStack_58;
  reader._reader._40_8_ = in_stack_fffffffffffffa48;
  checkTestMessage(reader);
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::releaseParams((CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
                   *)&this_local);
  local_570 = (CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
               *)&this_local;
  kj::
  runCatchingExceptions<capnp::_::TestInterfaceImpl::baz(capnp::CallContext<capnproto_test::capnp::test::TestInterface::BazParams,capnproto_test::capnp::test::TestInterface::BazResults>)::__0>
            (&local_568,(kj *)&local_570,func);
  kj::_::DebugExpressionStart::operator<<
            (&local_3d0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_568);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_238,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_3d0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_3d0);
  kj::Maybe<kj::Exception>::~Maybe(&local_568);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_238);
  if (!bVar1) {
    local_57d = kj::_::Debug::shouldLog(ERROR);
    while (local_57d != false) {
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x392,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none\", _kjCondition"
                 ,(char (*) [89])
                  "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_238);
      local_57d = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_238);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::baz(BazContext context) {
  ++callCount;
  auto params = context.getParams();
  checkTestMessage(params.getS());
  context.releaseParams();
  EXPECT_ANY_THROW(context.getParams());

  return kj::READY_NOW;
}